

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdNegatePrivkey(void *handle,char *privkey,char **output)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  KeyApi api;
  Privkey key;
  string local_68;
  Privkey local_48;
  
  cfd::Initialize();
  if (output == (char **)0x0) {
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x65e;
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdNegatePrivkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. output is null.",(allocator *)&local_68);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_68,privkey,(allocator *)&local_48);
    cfd::api::KeyApi::GetPrivkey(&key,&api,&local_68,(NetType *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&local_68);
    cfd::core::Privkey::CreateNegate(&local_48,&key);
    cfd::core::Privkey::GetHex_abi_cxx11_(&local_68,&local_48);
    pcVar2 = cfd::capi::CreateString(&local_68);
    *output = pcVar2;
    std::__cxx11::string::~string((string *)&local_68);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
    return 0;
  }
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x664;
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdNegatePrivkey";
  cfd::core::logger::warn<>((CfdSourceLocation *)&key,"privkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&key,"Failed to parameter. privkey is null or empty.",(allocator *)&local_68)
  ;
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&key);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdNegatePrivkey(void* handle, const char* privkey, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }

    KeyApi api;
    Privkey key = api.GetPrivkey(std::string(privkey), nullptr, nullptr);
    *output = CreateString(key.CreateNegate().GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}